

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetupDrawData(ImVector<ImDrawList_*> *draw_lists,ImDrawData *draw_data)

{
  undefined1 *in_RSI;
  int *in_RDI;
  int n;
  ImGuiIO *io;
  undefined8 local_30;
  int local_24;
  ImVec2 local_20;
  ImGuiIO *local_18;
  undefined1 *local_10;
  int *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = ImGui::GetIO();
  *local_10 = 1;
  if (*local_8 < 1) {
    local_30 = 0;
  }
  else {
    local_30 = *(undefined8 *)(local_8 + 2);
  }
  *(undefined8 *)(local_10 + 8) = local_30;
  *(int *)(local_10 + 0x10) = *local_8;
  *(undefined4 *)(local_10 + 0x14) = 0;
  *(undefined4 *)(local_10 + 0x18) = 0;
  ImVec2::ImVec2(&local_20,0.0,0.0);
  *(ImVec2 *)(local_10 + 0x1c) = local_20;
  *(ImVec2 *)(local_10 + 0x24) = local_18->DisplaySize;
  for (local_24 = 0; local_24 < *local_8; local_24 = local_24 + 1) {
    *(int *)(local_10 + 0x18) =
         *(int *)(*(long *)(*(long *)(local_8 + 2) + (long)local_24 * 8) + 0x20) +
         *(int *)(local_10 + 0x18);
    *(int *)(local_10 + 0x14) =
         *(int *)(*(long *)(*(long *)(local_8 + 2) + (long)local_24 * 8) + 0x10) +
         *(int *)(local_10 + 0x14);
  }
  return;
}

Assistant:

static void SetupDrawData(ImVector<ImDrawList*>* draw_lists, ImDrawData* draw_data)
{
    ImGuiIO& io = ImGui::GetIO();
    draw_data->Valid = true;
    draw_data->CmdLists = (draw_lists->Size > 0) ? draw_lists->Data : NULL;
    draw_data->CmdListsCount = draw_lists->Size;
    draw_data->TotalVtxCount = draw_data->TotalIdxCount = 0;
    draw_data->DisplayPos = ImVec2(0.0f, 0.0f);
    draw_data->DisplaySize = io.DisplaySize;
    for (int n = 0; n < draw_lists->Size; n++)
    {
        draw_data->TotalVtxCount += draw_lists->Data[n]->VtxBuffer.Size;
        draw_data->TotalIdxCount += draw_lists->Data[n]->IdxBuffer.Size;
    }
}